

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int archive_read_format_rar_read_header(archive_read *a,archive_entry *entry)

{
  short sVar1;
  ushort uVar2;
  uint *puVar3;
  long lVar4;
  short sVar5;
  archive_entry *entry_00;
  int iVar6;
  int *piVar7;
  short *psVar8;
  uchar *buf;
  uLong uVar9;
  void *pvVar10;
  char *fmt;
  long request;
  size_t min;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  ssize_t did_read;
  uint *local_40;
  archive_entry *local_38;
  
  (a->archive).archive_format = 0xd0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "RAR";
  }
  puVar3 = (uint *)a->format->data;
  if (puVar3[0x13c4] == 0xffffffff) {
    puVar3[0x13c4] = 0;
  }
  piVar7 = (int *)__archive_read_ahead(a,7,(ssize_t *)0x0);
  if (piVar7 == (int *)0x0) {
    iVar6 = 1;
  }
  else {
    local_40 = puVar3;
    local_38 = entry;
    if ((puVar3[0x3e] != 0) ||
       ((((char)*piVar7 != 'M' || (*(char *)((long)piVar7 + 1) != 'Z')) && (*piVar7 != 0x464c457f)))
       ) {
LAB_00351974:
      local_40[0x3e] = 1;
LAB_00351991:
      uVar12 = 7;
      psVar8 = (short *)__archive_read_ahead(a,7,(ssize_t *)0x0);
      if (psVar8 == (short *)0x0) goto LAB_00351ca3;
      sVar5 = psVar8[1];
      switch((char)sVar5) {
      case 'r':
        iVar6 = bcmp(psVar8,"Rar!\x1a\a",7);
        if (iVar6 != 0) {
          fmt = "Invalid marker header";
          goto LAB_00351c96;
        }
        break;
      case 's':
        *local_40 = (uint)*(ushort *)((long)psVar8 + 3);
        uVar2 = *(ushort *)((long)psVar8 + 5);
        uVar12 = (ulong)uVar2;
        if (uVar12 < 0xd) {
LAB_00351c37:
          fmt = "Invalid header size";
          goto LAB_00351c96;
        }
        psVar8 = (short *)__archive_read_ahead(a,uVar12,(ssize_t *)0x0);
        entry_00 = local_38;
        if (psVar8 == (short *)0x0) goto LAB_00351ca3;
        *(undefined2 *)(local_40 + 4) = *(undefined2 *)((long)psVar8 + 7);
        *(undefined4 *)((long)local_40 + 0x12) = *(undefined4 *)((long)psVar8 + 9);
        if ((*local_40 >> 9 & 1) != 0) {
          if (uVar2 == 0xd) goto LAB_00351c37;
          *(undefined1 *)((long)local_40 + 0x16) = *(undefined1 *)((long)psVar8 + 0xd);
        }
        if ((char)*local_40 < '\0') {
          archive_entry_set_is_metadata_encrypted(local_38,'\x01');
          archive_entry_set_is_data_encrypted(entry_00,'\x01');
          local_40[0x13c4] = 1;
          fmt = "RAR encryption support unavailable.";
          goto LAB_00351c96;
        }
        uVar9 = cm_zlib_crc32(0,(uchar *)(psVar8 + 1),uVar2 - 2);
        if (*psVar8 != (short)uVar9) goto LAB_00351c2a;
        break;
      case 't':
        iVar6 = read_header(a,local_38,'t');
        return iVar6;
      case 'u':
      case 'v':
      case 'w':
      case 'x':
      case 'y':
      case '{':
        uVar12 = (ulong)*(ushort *)((long)psVar8 + 5);
        if (uVar12 < 7) {
LAB_00351c06:
          fmt = "Invalid header size too small";
          goto LAB_00351c96;
        }
        if (*(short *)((long)psVar8 + 3) < 0) {
          if (*(ushort *)((long)psVar8 + 5) < 0xb) goto LAB_00351c06;
          psVar8 = (short *)__archive_read_ahead(a,uVar12,(ssize_t *)0x0);
          if (psVar8 == (short *)0x0) goto LAB_00351ca3;
          uVar12 = uVar12 + *(uint *)((long)psVar8 + 7);
        }
        sVar1 = *psVar8;
        __archive_read_consume(a,2);
        uVar9 = 0;
        for (uVar12 = uVar12 - 2; uVar12 != 0;
            uVar12 = uVar12 - CONCAT44(did_read._4_4_,(uint)did_read)) {
          min = 0x8000;
          if (uVar12 < 0x8000) {
            min = uVar12;
          }
          buf = (uchar *)__archive_read_ahead(a,min,&did_read);
          if (buf == (uchar *)0x0) goto LAB_00351ca3;
          uVar9 = cm_zlib_crc32(uVar9,buf,(uint)did_read);
          __archive_read_consume(a,CONCAT44(did_read._4_4_,(uint)did_read));
        }
        if (sVar1 != (short)uVar9) {
LAB_00351c2a:
          fmt = "Header CRC error";
          goto LAB_00351c96;
        }
        if ((char)sVar5 == '{') {
          return 1;
        }
        goto LAB_00351991;
      case 'z':
        goto switchD_003519c0_caseD_7a;
      default:
        fmt = "Bad RAR file";
        goto LAB_00351c96;
      }
      __archive_read_consume(a,uVar12);
      goto LAB_00351991;
    }
    uVar12 = 0x1000;
    lVar11 = 0;
    while( true ) {
      while( true ) {
        if (0x20000 < lVar11 + uVar12) goto LAB_00351bfa;
        pvVar10 = __archive_read_ahead(a,uVar12,&did_read);
        if (pvVar10 != (void *)0x0) break;
        bVar13 = uVar12 < 0x80;
        uVar12 = uVar12 >> 1;
        if (bVar13) goto LAB_00351bfa;
      }
      lVar4 = CONCAT44(did_read._4_4_,(uint)did_read);
      if (lVar4 < 0x40) break;
      for (request = 0; (ulong)((long)pvVar10 + request + 7) < (ulong)(lVar4 + (long)pvVar10);
          request = request + 0x10) {
        iVar6 = bcmp((void *)((long)pvVar10 + request),"Rar!\x1a\a",7);
        if (iVar6 == 0) {
          __archive_read_consume(a,request);
          goto LAB_00351974;
        }
      }
      __archive_read_consume(a,request);
      lVar11 = lVar11 + request;
    }
LAB_00351bfa:
    fmt = "Couldn\'t find out RAR header";
LAB_00351c96:
    archive_set_error(&a->archive,0x54,fmt);
LAB_00351ca3:
    iVar6 = -0x1e;
  }
  return iVar6;
switchD_003519c0_caseD_7a:
  iVar6 = read_header(a,local_38,'z');
  if (iVar6 < -0x14) {
    return iVar6;
  }
  goto LAB_00351991;
}

Assistant:

static int
archive_read_format_rar_read_header(struct archive_read *a,
                                    struct archive_entry *entry)
{
  const void *h;
  const char *p;
  struct rar *rar;
  size_t skip;
  char head_type;
  int ret;
  unsigned flags;
  unsigned long crc32_expected;

  a->archive.archive_format = ARCHIVE_FORMAT_RAR;
  if (a->archive.archive_format_name == NULL)
    a->archive.archive_format_name = "RAR";

  rar = (struct rar *)(a->format->data);

  /*
   * It should be sufficient to call archive_read_next_header() for
   * a reader to determine if an entry is encrypted or not. If the
   * encryption of an entry is only detectable when calling
   * archive_read_data(), so be it. We'll do the same check there
   * as well.
   */
  if (rar->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
	  rar->has_encrypted_entries = 0;
  }

  /* RAR files can be generated without EOF headers, so return ARCHIVE_EOF if
  * this fails.
  */
  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_EOF);

  p = h;
  if (rar->found_first_header == 0 &&
     ((p[0] == 'M' && p[1] == 'Z') || memcmp(p, "\x7F\x45LF", 4) == 0)) {
    /* This is an executable ? Must be self-extracting... */
    ret = skip_sfx(a);
    if (ret < ARCHIVE_WARN)
      return (ret);
  }
  rar->found_first_header = 1;

  while (1)
  {
    unsigned long crc32_val;

    if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
      return (ARCHIVE_FATAL);
    p = h;

    head_type = p[2];
    switch(head_type)
    {
    case MARK_HEAD:
      if (memcmp(p, RAR_SIGNATURE, 7) != 0) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid marker header");
        return (ARCHIVE_FATAL);
      }
      __archive_read_consume(a, 7);
      break;

    case MAIN_HEAD:
      rar->main_flags = archive_le16dec(p + 3);
      skip = archive_le16dec(p + 5);
      if (skip < 7 + sizeof(rar->reserved1) + sizeof(rar->reserved2)) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid header size");
        return (ARCHIVE_FATAL);
      }
      if ((h = __archive_read_ahead(a, skip, NULL)) == NULL)
        return (ARCHIVE_FATAL);
      p = h;
      memcpy(rar->reserved1, p + 7, sizeof(rar->reserved1));
      memcpy(rar->reserved2, p + 7 + sizeof(rar->reserved1),
             sizeof(rar->reserved2));
      if (rar->main_flags & MHD_ENCRYPTVER) {
        if (skip < 7 + sizeof(rar->reserved1) + sizeof(rar->reserved2)+1) {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
            "Invalid header size");
          return (ARCHIVE_FATAL);
        }
        rar->encryptver = *(p + 7 + sizeof(rar->reserved1) +
                            sizeof(rar->reserved2));
      }

      /* Main header is password encrypted, so we cannot read any
         file names or any other info about files from the header. */
      if (rar->main_flags & MHD_PASSWORD)
      {
        archive_entry_set_is_metadata_encrypted(entry, 1);
        archive_entry_set_is_data_encrypted(entry, 1);
        rar->has_encrypted_entries = 1;
         archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "RAR encryption support unavailable.");
        return (ARCHIVE_FATAL);
      }

      crc32_val = crc32(0, (const unsigned char *)p + 2, (unsigned)skip - 2);
      if ((crc32_val & 0xffff) != archive_le16dec(p)) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Header CRC error");
        return (ARCHIVE_FATAL);
      }
      __archive_read_consume(a, skip);
      break;

    case FILE_HEAD:
      return read_header(a, entry, head_type);

    case COMM_HEAD:
    case AV_HEAD:
    case SUB_HEAD:
    case PROTECT_HEAD:
    case SIGN_HEAD:
    case ENDARC_HEAD:
      flags = archive_le16dec(p + 3);
      skip = archive_le16dec(p + 5);
      if (skip < 7) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid header size too small");
        return (ARCHIVE_FATAL);
      }
      if (flags & HD_ADD_SIZE_PRESENT)
      {
        if (skip < 7 + 4) {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
            "Invalid header size too small");
          return (ARCHIVE_FATAL);
        }
        if ((h = __archive_read_ahead(a, skip, NULL)) == NULL)
          return (ARCHIVE_FATAL);
        p = h;
        skip += archive_le32dec(p + 7);
      }

      /* Skip over the 2-byte CRC at the beginning of the header. */
      crc32_expected = archive_le16dec(p);
      __archive_read_consume(a, 2);
      skip -= 2;

      /* Skim the entire header and compute the CRC. */
      crc32_val = 0;
      while (skip > 0) {
	      size_t to_read = skip;
	      ssize_t did_read;
	      if (to_read > 32 * 1024) {
		      to_read = 32 * 1024;
	      }
	      if ((h = __archive_read_ahead(a, to_read, &did_read)) == NULL) {
		      return (ARCHIVE_FATAL);
	      }
	      p = h;
	      crc32_val = crc32(crc32_val, (const unsigned char *)p, (unsigned)did_read);
	      __archive_read_consume(a, did_read);
	      skip -= did_read;
      }
      if ((crc32_val & 0xffff) != crc32_expected) {
	      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		  "Header CRC error");
	      return (ARCHIVE_FATAL);
      }
      if (head_type == ENDARC_HEAD)
	      return (ARCHIVE_EOF);
      break;

    case NEWSUB_HEAD:
      if ((ret = read_header(a, entry, head_type)) < ARCHIVE_WARN)
        return ret;
      break;

    default:
      archive_set_error(&a->archive,  ARCHIVE_ERRNO_FILE_FORMAT,
                        "Bad RAR file");
      return (ARCHIVE_FATAL);
    }
  }
}